

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O3

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnStricmp_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnStricmp_Test *this)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  AssertionResult iutest_ar;
  int *in_stack_fffffffffffffde8;
  AssertionResult local_210;
  AssertionHelper local_1e8;
  undefined1 local_1b8 [392];
  
  local_1b8._0_4_ = 0;
  lVar6 = 0;
  do {
    if (lVar6 == 3) {
      local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0;
      break;
    }
    cVar1 = "aaaa"[lVar6 + 1];
    uVar2 = toupper((int)"AAAA"[lVar6 + 1]);
    uVar3 = toupper((int)cVar1);
    lVar6 = lVar6 + 1;
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
         (uVar2 & 0xff) - (uVar3 & 0xff);
  } while ((int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p == 0);
  iutest::internal::CmpHelperEQ<int,int>
            (&local_210,(internal *)0x16fae4,
             "::iutest::detail::wrapper::iu_stricmp(\"AAA\", \"aaa\")",local_1b8,(int *)&local_1e8,
             in_R9);
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x24;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar6 = 0;
  do {
    if (lVar6 == 4) {
      iVar4 = 0;
      uVar2 = toupper(0);
      uVar3 = toupper(iVar4);
      iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
      break;
    }
    cVar1 = "aaaa"[lVar6 + 1];
    uVar2 = toupper((int)"AAAa"[lVar6]);
    uVar3 = toupper((int)cVar1);
    lVar6 = lVar6 + 1;
    iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
  } while (iVar4 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar4;
  if (iVar4 < 1) {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_stricmp(\"AAAa\", \"aaa\")","<",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
    if ((local_210.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdef);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x25;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  else {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar6 = 0;
  do {
    if (lVar6 == 4) {
      local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0;
      goto LAB_001519ff;
    }
    cVar1 = "aaaa"[lVar6];
    uVar2 = toupper((int)"AAAB"[lVar6]);
    uVar3 = toupper((int)cVar1);
    lVar6 = lVar6 + 1;
    iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
  } while (iVar4 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar4;
  if (iVar4 == 0 || (uVar2 & 0xff) < (uVar3 & 0xff)) {
LAB_001519ff:
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_stricmp(\"AAAB\", \"aaaa\")","<",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
    if ((local_210.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdef);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x26;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  else {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar6 = 0;
  do {
    if (lVar6 == 4) {
      local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0;
      goto LAB_00151b5e;
    }
    cVar1 = "aaab"[lVar6];
    uVar2 = toupper((int)"AAAA"[lVar6]);
    uVar3 = toupper((int)cVar1);
    lVar6 = lVar6 + 1;
    iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
  } while (iVar4 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar4;
  if (iVar4 < 0) {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  else {
LAB_00151b5e:
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_stricmp(\"AAAA\", \"aaab\")",">",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
    if ((local_210.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdef);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x27;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  paVar5 = &local_210.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar5) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar6 = 0;
  do {
    if (lVar6 == 3) {
      uVar2 = toupper(0);
      uVar3 = toupper(-1);
      iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
      break;
    }
    cVar1 = (&DAT_0016e32a)[lVar6];
    uVar2 = toupper((int)"AAAA"[lVar6 + 1]);
    uVar3 = toupper((int)cVar1);
    lVar6 = lVar6 + 1;
    iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
  } while (iVar4 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar4;
  if (iVar4 < 0) {
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
    local_210.m_message._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_stricmp(\"AAA\", negative_sample)",">",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
    if ((local_210.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdef);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x28;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar5) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar6 = 0;
  do {
    if (lVar6 == 3) {
      uVar2 = toupper(0);
      uVar3 = toupper(0x41);
      iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
      break;
    }
    cVar1 = "aaaA"[lVar6];
    uVar2 = toupper((int)"AAAA"[lVar6 + 1]);
    uVar3 = toupper((int)cVar1);
    lVar6 = lVar6 + 1;
    iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
  } while (iVar4 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar4;
  if (iVar4 < 0) {
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
    local_210.m_message._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_stricmp(\"AAA\", \"aaaA\")",">",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
    if ((local_210.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdef);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x29;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar5) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnStricmp)
{
    const char negative = static_cast<char>(-1);
    const char negative_sample[] = { 'a', 'a', 'a', negative, '\0' };
    IUTEST_EXPECT_EQ(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAa", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAB", "aaaa"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAAA", "aaab"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", negative_sample));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaaA"));
}